

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<_3562ccc5_> __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
::
emplace_new_key<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>
          (sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
          *args)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  pointer pcVar5;
  tuple<slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
  tVar6;
  _Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
  _Var7;
  undefined8 uVar8;
  EntryPointer psVar9;
  long lVar10;
  char cVar11;
  undefined8 unaff_RBP;
  undefined7 uVar13;
  ulong uVar12;
  size_t sVar14;
  EntryPointer psVar15;
  char __tmp_1;
  sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
  sVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  pair<_3562ccc5_> pVar19;
  value_type to_insert;
  undefined1 local_60 [32];
  _Head_base<0UL,_slang::SourceManager::FileData_*,_false> local_40;
  anon_union_40_1_a8c68091_for_sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>_3
  *local_38;
  
  lVar4 = *(long *)(this + 8);
  if ((lVar4 != 0) &&
     (this[0x11] !=
      (sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
       )distance_from_desired)) {
    lVar10 = *(long *)(this + 0x18) + 1;
    auVar17._8_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar17._0_8_ = lVar10;
    auVar17._12_4_ = 0x45300000;
    lVar1 = lVar4 + 1;
    auVar18._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar18._0_8_ = lVar1;
    auVar18._12_4_ = 0x45300000;
    if ((auVar17._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x14) *
        ((auVar18._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) {
      paVar3 = &key->field_2;
      uVar13 = (undefined7)((ulong)unaff_RBP >> 8);
      if (current_entry->distance_from_desired < '\0') {
        paVar2 = &(current_entry->field_1).value.first.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&current_entry->field_1 = paVar2;
        pcVar5 = (key->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 == paVar3) {
          uVar8 = *(undefined8 *)((long)&key->field_2 + 8);
          paVar2->_M_allocated_capacity = paVar3->_M_allocated_capacity;
          *(undefined8 *)((long)&(current_entry->field_1).value.first.field_2 + 8) = uVar8;
        }
        else {
          (current_entry->field_1).value.first._M_dataplus._M_p = pcVar5;
          (current_entry->field_1).value.first.field_2._M_allocated_capacity =
               paVar3->_M_allocated_capacity;
        }
        (current_entry->field_1).value.first._M_string_length = key->_M_string_length;
        (key->_M_dataplus)._M_p = (pointer)paVar3;
        key->_M_string_length = 0;
        (key->field_2)._M_local_buf[0] = '\0';
        (current_entry->field_1).value.second._M_t.
        super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
        ._M_t.
        super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
        .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
             (args->_M_t).
             super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
             .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
        (args->_M_t).
        super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
        ._M_t.
        super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
        .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
             (FileData *)0x0;
        current_entry->distance_from_desired = distance_from_desired;
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        uVar12 = CONCAT71(uVar13,1);
      }
      else {
        local_60._0_8_ = local_60 + 0x10;
        pcVar5 = (key->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 == paVar3) {
          local_60._16_8_ = paVar3->_M_allocated_capacity;
          local_60._24_8_ = *(undefined8 *)((long)&key->field_2 + 8);
        }
        else {
          local_60._16_8_ = paVar3->_M_allocated_capacity;
          local_60._0_8_ = pcVar5;
        }
        local_60._8_8_ = key->_M_string_length;
        (key->_M_dataplus)._M_p = (pointer)paVar3;
        key->_M_string_length = 0;
        (key->field_2)._M_local_buf[0] = '\0';
        local_40._M_head_impl =
             (args->_M_t).
             super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
             .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
        (args->_M_t).
        super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
        ._M_t.
        super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
        .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
             (FileData *)0x0;
        cVar11 = current_entry->distance_from_desired;
        current_entry->distance_from_desired = distance_from_desired;
        std::__cxx11::string::swap((string *)local_60);
        tVar6.
        super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
        .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
              )(current_entry->field_1).value.second._M_t.
               super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
               .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
        (current_entry->field_1).value.second._M_t.
        super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
        ._M_t.
        super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
        .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
             local_40._M_head_impl;
        sVar16 = (sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
                  )(cVar11 + '\x01');
        psVar15 = current_entry + 1;
        cVar11 = current_entry[1].distance_from_desired;
        psVar9 = current_entry;
        local_40._M_head_impl =
             (FileData *)
             tVar6.
             super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
             .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
        if (-1 < cVar11) {
          local_38 = &current_entry->field_1;
          do {
            psVar9 = psVar15;
            if (cVar11 < (char)sVar16) {
              psVar9->distance_from_desired = (int8_t)sVar16;
              std::__cxx11::string::swap((string *)local_60);
              _Var7.super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
                   (_Head_base<0UL,_slang::SourceManager::FileData_*,_false>)
                   (psVar9->field_1).value.second._M_t.
                   super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                   .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
              (psVar9->field_1).value.second._M_t.
              super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
              .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
                   local_40._M_head_impl;
              sVar16 = (sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
                        )(cVar11 + '\x01');
              local_40._M_head_impl =
                   (FileData *)
                   _Var7.super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl
              ;
            }
            else {
              sVar16 = (sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
                        )((char)sVar16 + '\x01');
              if (sVar16 == this[0x11]) {
                std::__cxx11::string::swap((string *)local_60);
                tVar6.
                super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
                     (_Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                      )(current_entry->field_1).value.second._M_t.
                       super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                       .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
                (current_entry->field_1).value.second._M_t.
                super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                ._M_t.
                super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
                     local_40._M_head_impl;
                uVar12 = *(long *)(this + 8) * 2 + 2;
                sVar14 = 4;
                if (4 < uVar12) {
                  sVar14 = uVar12;
                }
                local_40._M_head_impl =
                     (FileData *)
                     tVar6.
                     super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                     .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
                sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>_>_>
                ::rehash((sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>_>_>
                          *)this,sVar14);
                pVar19 = emplace<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>
                                   (this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>
                                          *)local_60);
                current_entry = (EntryPointer)pVar19.first.current;
                uVar12 = (ulong)pVar19._8_4_;
                goto LAB_001ad79e;
              }
            }
            cVar11 = psVar9[1].distance_from_desired;
            psVar15 = psVar9 + 1;
          } while (-1 < cVar11);
        }
        paVar3 = &psVar9[1].field_1.value.first.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&psVar9[1].field_1 = paVar3;
        if ((undefined1 *)local_60._0_8_ == local_60 + 0x10) {
          paVar3->_M_allocated_capacity = local_60._16_8_;
          *(undefined8 *)((long)&psVar9[1].field_1.value.first.field_2 + 8) = local_60._24_8_;
        }
        else {
          psVar9[1].field_1.value.first._M_dataplus._M_p = (pointer)local_60._0_8_;
          psVar9[1].field_1.value.first.field_2._M_allocated_capacity = local_60._16_8_;
        }
        psVar9[1].field_1.value.first._M_string_length = local_60._8_8_;
        local_60._8_8_ = 0;
        local_60._16_8_ = local_60._16_8_ & 0xffffffffffffff00;
        psVar9[1].field_1.value.second._M_t.
        super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
        ._M_t.
        super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
        .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
             local_40._M_head_impl;
        local_40._M_head_impl = (FileData *)0x0;
        psVar15->distance_from_desired = (int8_t)sVar16;
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        uVar12 = CONCAT71(uVar13,1);
        local_60._0_8_ = local_60 + 0x10;
LAB_001ad79e:
        if ((_Head_base<0UL,_slang::SourceManager::FileData_*,_false>)local_40._M_head_impl !=
            (_Head_base<0UL,_slang::SourceManager::FileData_*,_false>)0x0) {
          std::default_delete<slang::SourceManager::FileData>::operator()
                    ((default_delete<slang::SourceManager::FileData> *)&local_40,
                     local_40._M_head_impl);
        }
        local_40._M_head_impl = (FileData *)0x0;
        if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
          operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
        }
      }
      goto LAB_001ad576;
    }
  }
  uVar12 = lVar4 * 2 + 2;
  sVar14 = 4;
  if (4 < uVar12) {
    sVar14 = uVar12;
  }
  sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>_>_>
  ::rehash((sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>_>_>
            *)this,sVar14);
  pVar19 = emplace<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>
                     (this,key,args);
  current_entry = (EntryPointer)pVar19.first.current;
  uVar12 = (ulong)pVar19._8_4_;
LAB_001ad576:
  pVar19._8_8_ = uVar12 & 0xffffffff;
  pVar19.first.current = current_entry;
  return pVar19;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }